

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O2

void __thiscall soul::Program::Program(Program *this,ProgramImpl *p,bool holdRef)

{
  undefined3 in_register_00000011;
  RefCountedPtr<soul::Program::ProgramImpl> local_18;
  
  this->pimpl = p;
  (this->refHolder).object = (ProgramImpl *)0x0;
  if (CONCAT31(in_register_00000011,holdRef) != 0) {
    (p->super_RefCountedObject).refCount = (p->super_RefCountedObject).refCount + 1;
    local_18.object = p;
    RefCountedPtr<soul::Program::ProgramImpl>::operator=(&this->refHolder,&local_18);
    RefCountedPtr<soul::Program::ProgramImpl>::~RefCountedPtr(&local_18);
  }
  return;
}

Assistant:

Program::Program (ProgramImpl& p, bool holdRef) : pimpl (&p) { if (holdRef) refHolder = p; }